

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_readlink(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_fs_t req;
  undefined1 local_1c0 [88];
  long local_168;
  long local_160;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(::loop,local_1c0,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(::loop,0);
    if (iVar1 == 0) {
      if (dummy_cb_count == 1) {
        if (local_160 != 0) {
          uVar2 = 0x7df;
LAB_00125a70:
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                  ,uVar2,"req.ptr","==","NULL",local_160,"==",0);
          abort();
        }
        if (local_168 == -2) {
          uv_fs_req_cleanup(local_1c0);
          iVar1 = uv_fs_readlink(0,local_1c0,"no_such_file",0);
          if (iVar1 == -2) {
            if (local_160 != 0) {
              uVar2 = 0x7e4;
              goto LAB_00125a70;
            }
            if (local_168 == -2) {
              uv_fs_req_cleanup(local_1c0);
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              uVar2 = uv_default_loop();
              iVar1 = uv_loop_close(uVar2);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uVar2 = 0x7e8;
            }
            else {
              pcVar3 = "req.result == UV_ENOENT";
              uVar2 = 0x7e5;
            }
          }
          else {
            pcVar3 = "UV_ENOENT == uv_fs_readlink(NULL, &req, \"no_such_file\", NULL)";
            uVar2 = 0x7e3;
          }
        }
        else {
          pcVar3 = "req.result == UV_ENOENT";
          uVar2 = 0x7e0;
        }
      }
      else {
        pcVar3 = "dummy_cb_count == 1";
        uVar2 = 0x7de;
      }
    }
    else {
      pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
      uVar2 = 0x7dd;
    }
  }
  else {
    pcVar3 = "0 == uv_fs_readlink(loop, &req, \"no_such_file\", dummy_cb)";
    uVar2 = 0x7dc;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_readlink) {
  uv_fs_t req;

  loop = uv_default_loop();
  ASSERT(0 == uv_fs_readlink(loop, &req, "no_such_file", dummy_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(dummy_cb_count == 1);
  ASSERT_NULL(req.ptr);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  ASSERT(UV_ENOENT == uv_fs_readlink(NULL, &req, "no_such_file", NULL));
  ASSERT_NULL(req.ptr);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}